

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O0

void deCommandLine_selfTest(void)

{
  char *local_168;
  char *ref_10 [2];
  char *cmdLine_10;
  char *ref_9 [2];
  char *cmdLine_9;
  char *ref_8 [2];
  char *cmdLine_8;
  char *ref_7 [4];
  char *cmdLine_7;
  char *ref_6 [4];
  char *cmdLine_6;
  char *ref_5 [3];
  char *cmdLine_5;
  char *ref_4 [3];
  char *cmdLine_4;
  char *ref_3 [2];
  char *cmdLine_3;
  char *ref_2 [1];
  char *cmdLine_2;
  char *ref_1 [2];
  char *cmdLine_1;
  char *ref [1];
  char *cmdLine;
  
  ref[0] = "hello";
  cmdLine_1 = "hello";
  testParse("hello",&cmdLine_1,1);
  cmdLine_2 = "hello";
  ref_1[0] = "world";
  testParse("hello world",&cmdLine_2,2);
  ref_2[0] = "hello/world";
  cmdLine_3 = "hello/world";
  testParse("hello/world",&cmdLine_3,1);
  cmdLine_4 = "hello/world";
  ref_3[0] = "--help";
  testParse("hello/world --help",&cmdLine_4,2);
  ref_4[2] = "hello/world --help foo";
  cmdLine_5 = "hello/world";
  ref_4[0] = "--help";
  ref_4[1] = "foo";
  testParse("hello/world --help foo",&cmdLine_5,3);
  ref_5[2] = "hello\\world --help foo";
  cmdLine_6 = "hello\\world";
  ref_5[0] = "--help";
  ref_5[1] = "foo";
  testParse("hello\\world --help foo",&cmdLine_6,3);
  cmdLine_7 = "hello/worl d";
  ref_6[0] = "--help";
  ref_6[1] = "--foo=bar";
  ref_6[2] = "ba z\"";
  testParse("\"hello/worl d\" --help --foo=\"bar\" \"ba z\\\"\"",&cmdLine_7,4);
  cmdLine_8 = "hello/worl d";
  ref_7[0] = "--help";
  ref_7[1] = "--foo=bar";
  ref_7[2] = "ba z\'";
  testParse("\'hello/worl d\' --help --foo=\'bar\' \'ba z\\\'\'",&cmdLine_8,4);
  cmdLine_9 = "hello";
  ref_8[0] = "\'world\'";
  testParse("hello \"\'world\'\"",&cmdLine_9,2);
  cmdLine_10 = "hello";
  ref_9[0] = "\"world\"";
  testParse("hello \'\"world\"\'",&cmdLine_10,2);
  local_168 = "hello";
  ref_10[0] = "world\n";
  testParse("hello \"world\\n\"",&local_168,2);
  return;
}

Assistant:

void deCommandLine_selfTest (void)
{
	{
		const char* cmdLine	= "hello";
		const char* ref[]	= { "hello" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello world";
		const char* ref[]	= { "hello", "world" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world";
		const char* ref[]	= { "hello/world" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world --help";
		const char* ref[]	= { "hello/world", "--help" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello/world --help foo";
		const char* ref[]	= { "hello/world", "--help", "foo" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello\\world --help foo";
		const char* ref[]	= { "hello\\world", "--help", "foo" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "\"hello/worl d\" --help --foo=\"bar\" \"ba z\\\"\"";
		const char* ref[]	= { "hello/worl d", "--help", "--foo=bar", "ba z\"" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "'hello/worl d' --help --foo='bar' 'ba z\\\''";
		const char* ref[]	= { "hello/worl d", "--help", "--foo=bar", "ba z'" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello \"'world'\"";
		const char* ref[]	= { "hello", "'world'" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello '\"world\"'";
		const char* ref[]	= { "hello", "\"world\"" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
	{
		const char* cmdLine	= "hello \"world\\n\"";
		const char* ref[]	= { "hello", "world\n" };
		testParse(cmdLine, ref, DE_LENGTH_OF_ARRAY(ref));
	}
}